

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_palette.c
# Opt level: O0

bool_t prf_color_palette_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  bool bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  FILE *pFVar4;
  undefined8 in_RDX;
  long *in_RSI;
  bfile_t *in_RDI;
  prf_color_name_data *cdata;
  node_data *data;
  uint8_t *ptr;
  uint i;
  int pos;
  bfile_t *in_stack_ffffffffffffffc0;
  bfile_t *bfile_00;
  undefined8 in_stack_ffffffffffffffc8;
  uint uVar5;
  bfile_t *in_stack_ffffffffffffffd0;
  bfile_t *pbVar6;
  int in_stack_ffffffffffffffd8;
  uint uVar7;
  undefined4 in_stack_ffffffffffffffdc;
  pool_t pool_id;
  int iVar8;
  bool_t local_4;
  
  uVar5 = (uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  pool_id = (pool_t)((uint)in_stack_ffffffffffffffdc >> 0x10);
  uVar2 = bf_get_uint16_be(in_stack_ffffffffffffffc0);
  in_RDI->flags = uVar2;
  if (in_RDI->flags == prf_color_palette_info.opcode) {
    uVar2 = bf_get_uint16_be(in_stack_ffffffffffffffc0);
    *(uint16_t *)&in_RDI->field_0x2 = uVar2;
    if (in_RDI->file == (FILE *)0x0) {
      if (*(short *)(*in_RSI + 8) == 0) {
        pFVar4 = (FILE *)malloc((long)(int)(*(ushort *)&in_RDI->field_0x2 - 4));
        in_RDI->file = pFVar4;
      }
      else {
        pFVar4 = (FILE *)pool_malloc(pool_id,in_stack_ffffffffffffffd8);
        in_RDI->file = pFVar4;
      }
      if (in_RDI->file == (FILE *)0x0) {
        prf_error(6,"malloc returned NULL");
        bf_rewind(in_stack_ffffffffffffffd0,uVar5);
        return 0;
      }
    }
    uVar5 = (uint)((ulong)in_RDX >> 0x20);
    iVar8 = 4;
    pFVar4 = in_RDI->file;
    if (0x83 < *(ushort *)&in_RDI->field_0x2) {
      bf_read(in_RDI,(uint8_t *)in_RSI,uVar5);
      iVar8 = iVar8 + 0x80;
      uVar7 = 0;
      while( true ) {
        uVar5 = (uint)((ulong)in_RDX >> 0x20);
        bVar1 = false;
        if (uVar7 < 0x400) {
          bVar1 = iVar8 + 4 <= (int)(uint)*(ushort *)&in_RDI->field_0x2;
        }
        if (!bVar1) break;
        uVar3 = bf_get_uint32_be(in_stack_ffffffffffffffc0);
        *(uint32_t *)(pFVar4->_shortbuf + (ulong)uVar7 * 4 + -3) = uVar3;
        iVar8 = iVar8 + 4;
        uVar7 = uVar7 + 1;
      }
      if (iVar8 + 4 <= (int)(uint)*(ushort *)&in_RDI->field_0x2) {
        uVar3 = bf_get_uint32_be(in_stack_ffffffffffffffc0);
        *(uint32_t *)&pFVar4[0x13]._old_offset = uVar3;
        iVar8 = iVar8 + 4;
        bfile_00 = (bfile_t *)((long)&in_RDI->file[0x13]._old_offset + 4);
        for (uVar7 = 0; uVar5 = (uint)((ulong)in_RDX >> 0x20),
            uVar7 < (uint)pFVar4[0x13]._old_offset; uVar7 = uVar7 + 1) {
          pbVar6 = bfile_00;
          uVar2 = bf_get_uint16_be(bfile_00);
          bfile_00->flags = uVar2;
          uVar2 = bf_get_uint16_be(bfile_00);
          *(uint16_t *)&bfile_00->field_0x2 = uVar2;
          uVar2 = bf_get_uint16_be(bfile_00);
          *(uint16_t *)&bfile_00->field_0x4 = uVar2;
          uVar2 = bf_get_uint16_be(bfile_00);
          *(uint16_t *)&bfile_00->field_0x6 = uVar2;
          bf_read(in_RDI,(uint8_t *)in_RSI,(uint)((ulong)in_RDX >> 0x20));
          iVar8 = (uint)bfile_00->flags + iVar8;
          bfile_00 = (bfile_t *)((long)&pbVar6->flags + (long)(int)(uint)bfile_00->flags);
        }
      }
    }
    if (iVar8 < (int)(uint)*(ushort *)&in_RDI->field_0x2) {
      bf_read(in_RDI,(uint8_t *)in_RSI,uVar5);
    }
    local_4 = 1;
  }
  else {
    prf_error(9,"tried color palette loader for other node type");
    bf_rewind(in_stack_ffffffffffffffd0,uVar5);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static
bool_t
prf_color_palette_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_color_palette_info.opcode ) {
        prf_error( 9, "tried color palette loader for other node type" );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );

    if ( node->data == NULL ) { /* not pre-allocated */
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 6, "malloc returned NULL" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    pos = 4;
    do {
        unsigned int i;
        uint8_t * ptr;
        node_data * data;
        data = (node_data *) node->data;
        if ( node->length < (pos + 128) ) break;
        bf_read( bfile, (uint8_t *) data->reserved1, 128 ); pos += 128;
        for ( i = 0; i < 1024 && (pos + 4) <= node->length; i++ ) {
            data->brightest_rgb[i] = bf_get_uint32_be( bfile ); pos += 4;
#if 0
	    fprintf(stderr, "palette load (%d): 0x%x\n",
		    i, data->brightest_rgb[i]);
#endif
        }

        if ( node->length < (pos + 4) ) break;
        data->num_color_names = bf_get_uint32_be( bfile ); pos += 4;
        ptr = node->data + sizeof( node_data );

        i = 0;
        while ( i < data->num_color_names ) {
            struct prf_color_name_data * cdata;
            cdata = (struct prf_color_name_data *) ptr;
            cdata->length = bf_get_uint16_be( bfile );
            cdata->reserved1 = bf_get_uint16_be( bfile );
            cdata->index = bf_get_uint16_be( bfile );
            cdata->reserved2 = bf_get_uint16_be( bfile );
            bf_read( bfile, (uint8_t *) cdata->name, cdata->length - 8 );
            pos += cdata->length;
            ptr += cdata->length;
            i++;
        }
    } while ( FALSE );

    if ( pos < node->length )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}